

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O0

int gmlc::utilities::stringOps::trailingStringInt(string_view input,string *output,int defNum)

{
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  size_type sVar4;
  const_pointer __first;
  const_pointer __last;
  int in_ECX;
  __integer_from_chars_result_type<int> _Var5;
  basic_string_view<char,_std::char_traits<char>_> bVar6;
  basic_string_view<char,_std::char_traits<char>_> sub_1;
  basic_string_view<char,_std::char_traits<char>_> sub;
  size_t length;
  size_type pos1;
  int num;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  size_t in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  size_type in_stack_fffffffffffffea8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  char *local_78;
  errc local_70;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  size_type local_58;
  undefined8 local_40;
  char *local_38;
  size_type local_30;
  int local_28;
  int local_24;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_24 = in_ECX;
  bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
  if (!bVar1) {
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::back
                       ((basic_string_view<char,_std::char_traits<char>_> *)&local_18);
    iVar2 = isdigit((int)*pvVar3);
    if (iVar2 != 0) {
      local_28 = local_24;
      local_40 = 10;
      local_38 = "0123456789";
      bVar6._M_str = in_stack_fffffffffffffea0;
      bVar6._M_len = in_stack_fffffffffffffe98;
      local_30 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                           ((basic_string_view<char,_std::char_traits<char>_> *)
                            in_stack_fffffffffffffe90,bVar6,(size_type)in_stack_fffffffffffffe88);
      if (local_30 == 0xffffffffffffffff) {
        sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::length
                          ((basic_string_view<char,_std::char_traits<char>_> *)&local_18);
        if (sVar4 < 0xb) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          clear((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6a9786);
          iVar2 = (int)(in_stack_fffffffffffffea8 >> 0x20);
          CLI::std::basic_string_view<char,_std::char_traits<char>_>::data(&local_18);
          CLI::std::basic_string_view<char,_std::char_traits<char>_>::data(&local_18);
          CLI::std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
          std::from_chars<int>
                    (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                     (int *)in_stack_fffffffffffffeb0,iVar2);
          return local_28;
        }
        sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::length
                          ((basic_string_view<char,_std::char_traits<char>_> *)&local_18);
        local_30 = sVar4 - 10;
      }
      local_58 = std::basic_string_view<char,_std::char_traits<char>_>::length
                           ((basic_string_view<char,_std::char_traits<char>_> *)&local_18);
      if (local_30 == local_58 - 2) {
        pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::back
                           ((basic_string_view<char,_std::char_traits<char>_> *)&local_18);
        local_28 = *pvVar3 + -0x30;
      }
      else if ((local_58 < 0xb) || (local_58 - 10 <= local_30)) {
        local_68 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                             (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                              (size_type)in_stack_fffffffffffffea0);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::data(&local_68);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::data(&local_68);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::size(&local_68);
        _Var5 = std::from_chars<int>
                          (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                           (int *)in_stack_fffffffffffffeb0,(int)(in_stack_fffffffffffffea8 >> 0x20)
                          );
        local_78 = _Var5.ptr;
        local_70 = _Var5.ec;
      }
      else {
        local_88 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                             (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                              (size_type)in_stack_fffffffffffffea0);
        in_stack_fffffffffffffeb0 = &local_88;
        __first = CLI::std::basic_string_view<char,_std::char_traits<char>_>::data
                            (in_stack_fffffffffffffeb0);
        __last = CLI::std::basic_string_view<char,_std::char_traits<char>_>::data
                           (in_stack_fffffffffffffeb0);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::size(in_stack_fffffffffffffeb0);
        std::from_chars<int>
                  (__first,__last,(int *)in_stack_fffffffffffffeb0,
                   (int)(in_stack_fffffffffffffea8 >> 0x20));
        local_30 = local_58 - 10;
      }
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)&local_18,local_30);
      if (*pvVar3 != '_') {
        pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)&local_18,local_30);
        if (*pvVar3 != '#') {
          bVar6 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                             (size_type)in_stack_fffffffffffffea0);
          std::__cxx11::string::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     bVar6._M_str,in_stack_fffffffffffffe88);
          return local_28;
        }
      }
      std::basic_string_view<char,_std::char_traits<char>_>::substr
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                 (size_type)in_stack_fffffffffffffea0);
      std::__cxx11::string::operator=(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      return local_28;
    }
  }
  std::__cxx11::string::operator=(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  return local_24;
}

Assistant:

int trailingStringInt(
        std::string_view input,
        std::string& output,
        int defNum) noexcept
    {
        if ((input.empty()) || (isdigit(input.back()) == 0)) {
            output = input;
            return defNum;
        }
        int num = defNum;
        auto pos1 = input.find_last_not_of(digits);
        if (pos1 == std::string::npos)  // in case the whole thing is a number
        {
            if (input.length() <= 10) {
                output.clear();
                std::from_chars(input.data(), input.data() + input.size(), num);
                return num;
            }
            pos1 = input.length() - 10;
        }

        size_t length = input.length();
        if (pos1 == length - 2) {
            num = input.back() - '0';
        } else if (length <= 10 || pos1 >= length - 10) {
            auto sub = input.substr(pos1 + 1);
            std::from_chars(sub.data(), sub.data() + sub.size(), num);
        } else {
            auto sub = input.substr(length - 9);
            std::from_chars(sub.data(), sub.data() + sub.size(), num);
            pos1 = length - 10;
        }

        if (input[pos1] == '_' || input[pos1] == '#') {
            output = input.substr(0, pos1);
        } else {
            output = input.substr(0, pos1 + 1);
        }

        return num;
    }